

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Alt(Compiler *this,Frag a,Frag b)

{
  bool bVar1;
  uint32 begin;
  PatchList end;
  Frag FVar2;
  int id;
  Compiler *this_local;
  Frag b_local;
  Frag a_local;
  
  bVar1 = IsNoMatch(a);
  FVar2 = b;
  if ((!bVar1) && (bVar1 = IsNoMatch(b), FVar2 = a, !bVar1)) {
    begin = AllocInst(this,1);
    if ((int)begin < 0) {
      FVar2 = NoMatch(this);
    }
    else {
      b_local.begin = a.begin;
      this_local._0_4_ = b.begin;
      Prog::Inst::InitAlt(this->inst_ + (int)begin,b_local.begin,(uint32)this_local);
      b_local.end = a.end.p;
      this_local._4_4_ = b.end.p;
      end = PatchList::Append(this->inst_,b_local.end,this_local._4_4_);
      Frag::Frag(&a_local,begin,end);
      FVar2 = a_local;
    }
  }
  a_local = FVar2;
  return a_local;
}

Assistant:

Frag Compiler::Alt(Frag a, Frag b) {
  // Special case for convenience in loops.
  if (IsNoMatch(a))
    return b;
  if (IsNoMatch(b))
    return a;

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();

  inst_[id].InitAlt(a.begin, b.begin);
  return Frag(id, PatchList::Append(inst_, a.end, b.end));
}